

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

void __thiscall
duckdb::JoinFilterPushdownInfo::PushInFilter
          (JoinFilterPushdownInfo *this,JoinFilterPushdownFilter *info,JoinHashTable *ht,
          PhysicalOperator *op,idx_t filter_idx,idx_t filter_col_idx)

{
  size_type __n;
  bool bVar1;
  const_reference pvVar2;
  type this_00;
  pointer this_01;
  idx_t *piVar3;
  idx_t iVar4;
  TupleDataLayout *this_02;
  const_reference other;
  SelectionVector *scan_sel;
  SelectionVector *target_sel;
  tuple<duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_> this_03;
  OptionalFilter *this_04;
  DynamicTableFilterSet *this_05;
  idx_t index;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_420;
  vector<duckdb::Value,_true> in_list;
  LogicalType local_3e8;
  LogicalType local_3d0;
  Value local_3b8;
  value_set_t unique_ht_values;
  Vector build_vector;
  Vector tuples_addresses;
  JoinHTScanState join_ht_state;
  
  pvVar2 = vector<unsigned_long,_true>::operator[](&this->join_condition,filter_idx);
  __n = *pvVar2;
  this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(&ht->data_collection);
  LogicalType::LogicalType(&local_3d0,POINTER);
  this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(&ht->data_collection);
  piVar3 = TupleDataCollection::Count(this_01);
  Vector::Vector(&tuples_addresses,&local_3d0,*piVar3);
  LogicalType::~LogicalType(&local_3d0);
  iVar4 = TupleDataCollection::ChunkCount(this_00);
  TupleDataChunkIterator::TupleDataChunkIterator
            (&join_ht_state.iterator,this_00,KEEP_EVERYTHING_PINNED,0,iVar4,false);
  join_ht_state.offset_in_chunk = 0;
  iVar4 = JoinHashTable::FillWithHTOffsets(&join_ht_state,&tuples_addresses);
  this_02 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(&ht->layout_ptr);
  other = vector<duckdb::LogicalType,_true>::operator[](&this_02->types,__n);
  LogicalType::LogicalType(&local_3e8,other);
  Vector::Vector(&build_vector,&local_3e8,iVar4);
  LogicalType::~LogicalType(&local_3e8);
  scan_sel = FlatVector::IncrementalSelectionVector();
  target_sel = FlatVector::IncrementalSelectionVector();
  TupleDataCollection::Gather
            (this_00,&tuples_addresses,scan_sel,iVar4,__n,&build_vector,target_sel,
             (optional_ptr<duckdb::Vector,_true>)0x0);
  unique_ht_values._M_h._M_buckets = &unique_ht_values._M_h._M_single_bucket;
  unique_ht_values._M_h._M_bucket_count = 1;
  unique_ht_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_ht_values._M_h._M_element_count = 0;
  unique_ht_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unique_ht_values._M_h._M_rehash_policy._M_next_resize = 0;
  unique_ht_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (iVar4 != 0) {
    index = 0;
    do {
      Vector::GetValue(&local_3b8,&build_vector,index);
      in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&unique_ht_values;
      ::std::
      _Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::Value,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::Value,true>>>>
                ((_Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&unique_ht_values,&local_3b8,&in_list);
      Value::~Value(&local_3b8);
      index = index + 1;
    } while (iVar4 != index);
  }
  ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
  vector<std::__detail::_Node_iterator<duckdb::Value,true,true>,void>
            ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&in_list,
             (_Node_iterator<duckdb::Value,_true,_true>)unique_ht_values._M_h._M_before_begin._M_nxt
             ,(_Node_iterator<duckdb::Value,_true,_true>)0x0,(allocator_type *)&local_3b8);
  bVar1 = FilterCombiner::ContainsNull(&in_list);
  if (!bVar1) {
    bVar1 = FilterCombiner::IsDenseRange(&in_list);
    if (!bVar1) {
      this_03.
      super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
      super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>)
           operator_new(0x28);
      local_3b8.type_._0_8_ =
           in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_3b8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3b8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      InFilter::InFilter((InFilter *)
                         this_03.
                         super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                         .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl,
                         (vector<duckdb::Value,_true> *)&local_3b8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_3b8);
      this_04 = (OptionalFilter *)operator_new(0x18);
      local_3b8.type_._0_8_ =
           this_03.
           super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
           super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
      OptionalFilter::OptionalFilter
                (this_04,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_3b8);
      if ((_Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>)
          local_3b8.type_._0_8_ != (TableFilter *)0x0) {
        (**(code **)(*(long *)local_3b8.type_._0_8_ + 8))();
      }
      this_05 = shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator->(&info->dynamic_filters);
      local_420._M_head_impl = (TableFilter *)this_04;
      DynamicTableFilterSet::PushFilter
                (this_05,op,filter_col_idx,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_420);
      if ((OptionalFilter *)local_420._M_head_impl != (OptionalFilter *)0x0) {
        (*((TableFilter *)&(local_420._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
      }
      local_420._M_head_impl = (TableFilter *)0x0;
    }
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&in_list);
  ::std::
  _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&unique_ht_values._M_h);
  if (build_vector.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (build_vector.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (build_vector.buffer.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (build_vector.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (build_vector.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (build_vector.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
               internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&build_vector.type);
  TupleDataChunkState::~TupleDataChunkState(&join_ht_state.iterator.state.chunk_state);
  std::
  vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
             *)&join_ht_state.iterator.state.pin_state.heap_handles);
  std::
  vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
             *)&join_ht_state.iterator.state);
  if (tuples_addresses.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tuples_addresses.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (tuples_addresses.buffer.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tuples_addresses.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (tuples_addresses.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tuples_addresses.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
               internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&tuples_addresses.type);
  return;
}

Assistant:

void JoinFilterPushdownInfo::PushInFilter(const JoinFilterPushdownFilter &info, JoinHashTable &ht,
                                          const PhysicalOperator &op, idx_t filter_idx, idx_t filter_col_idx) const {
	// generate a "OR" filter (i.e. x=1 OR x=535 OR x=997)
	// first scan the entire vector at the probe side
	// FIXME: this code is duplicated from PerfectHashJoinExecutor::FullScanHashTable
	auto build_idx = join_condition[filter_idx];
	auto &data_collection = ht.GetDataCollection();

	Vector tuples_addresses(LogicalType::POINTER, ht.Count()); // allocate space for all the tuples

	JoinHTScanState join_ht_state(data_collection, 0, data_collection.ChunkCount(),
	                              TupleDataPinProperties::KEEP_EVERYTHING_PINNED);

	// Go through all the blocks and fill the keys addresses
	idx_t key_count = ht.FillWithHTOffsets(join_ht_state, tuples_addresses);

	// Scan the build keys in the hash table
	Vector build_vector(ht.layout_ptr->GetTypes()[build_idx], key_count);
	data_collection.Gather(tuples_addresses, *FlatVector::IncrementalSelectionVector(), key_count, build_idx,
	                       build_vector, *FlatVector::IncrementalSelectionVector(), nullptr);

	// generate the OR-clause - note that we only need to consider unique values here (so we use a seT)
	value_set_t unique_ht_values;
	for (idx_t k = 0; k < key_count; k++) {
		unique_ht_values.insert(build_vector.GetValue(k));
	}
	vector<Value> in_list(unique_ht_values.begin(), unique_ht_values.end());

	// generating the OR filter only makes sense if the range is
	// not dense and that the range does not contain NULL
	// i.e. if we have the values [0, 1, 2, 3, 4] - the min/max is fully equivalent to the OR filter
	if (FilterCombiner::ContainsNull(in_list) || FilterCombiner::IsDenseRange(in_list)) {
		return;
	}

	// generate the OR filter
	auto in_filter = make_uniq<InFilter>(std::move(in_list));

	// we push the OR filter as an OptionalFilter so that we can use it for zonemap pruning only
	// the IN-list is expensive to execute otherwise
	auto filter = make_uniq<OptionalFilter>(std::move(in_filter));
	info.dynamic_filters->PushFilter(op, filter_col_idx, std::move(filter));
	return;
}